

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

int rnd_class(int first,int last)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  short *psVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = last - first;
  if (iVar6 != 0) {
    if (first <= last) {
      psVar4 = &objects[first].oc_prob;
      iVar5 = iVar6 + 1;
      lVar7 = 0;
      do {
        lVar7 = (long)(int)lVar7 + (long)*psVar4;
        psVar4 = psVar4 + 0x14;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      if ((int)lVar7 != 0) {
        uVar3 = mt_random();
        if (first <= last) {
          iVar6 = SUB164(ZEXT416(uVar3) % SEXT816(lVar7),0) + 1;
          psVar4 = &objects[first].oc_prob;
          do {
            sVar1 = *psVar4;
            if ((sVar1 != 0) &&
               (iVar5 = iVar6 - sVar1, bVar2 = iVar6 < sVar1, iVar6 = iVar5, iVar5 == 0 || bVar2)) {
              return first;
            }
            first = first + 1;
            psVar4 = psVar4 + 0x14;
          } while (last + 1 != first);
        }
        return 0;
      }
    }
    uVar3 = mt_random();
    first = SUB164(ZEXT416(uVar3) % SEXT816((long)(iVar6 + 1)),0) + first;
  }
  return first;
}

Assistant:

int rnd_class(int first, int last)
{
	int i, x, sum=0;

	if (first == last)
	    return first;
	for (i=first; i<=last; i++)
		sum += objects[i].oc_prob;
	if (!sum) /* all zero */
		return first + rn2(last-first+1);
	x = rnd(sum);
	for (i=first; i<=last; i++)
		if (objects[i].oc_prob && (x -= objects[i].oc_prob) <= 0)
			return i;
	return 0;
}